

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::ModuleRoot::GetItemReferenceQuery
          (ModuleRoot *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  PropertyQueryFlags PVar1;
  BOOL BVar2;
  HostObjectBase **ppHVar3;
  HostObjectBase *pHVar4;
  RecyclableObject *pRVar5;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint32 index_local;
  Var originalInstance_local;
  ModuleRoot *this_local;
  
  PVar1 = DynamicObject::GetItemReferenceQuery
                    ((DynamicObject *)this,originalInstance,index,value,requestContext);
  BVar2 = JavascriptConversion::PropertyQueryFlagsToBoolean(PVar1);
  if (BVar2 == 0) {
    ppHVar3 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    if (*ppHVar3 != (HostObjectBase *)0x0) {
      pHVar4 = Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                         (&(this->super_RootObjectBase).hostObject);
      PVar1 = (**(code **)(*(long *)pHVar4 + 0x138))
                        (pHVar4,originalInstance,index,value,requestContext);
      BVar2 = JavascriptConversion::PropertyQueryFlagsToBoolean(PVar1);
      if (BVar2 != 0) {
        return Property_Found;
      }
    }
    pRVar5 = ScriptContext::GetMissingItemResult(requestContext);
    *value = pRVar5;
    this_local._4_4_ = Property_NotFound;
  }
  else {
    this_local._4_4_ = Property_Found;
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags ModuleRoot::GetItemReferenceQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetItemReferenceQuery(originalInstance, index, value, requestContext)))
        {
            return PropertyQueryFlags::Property_Found;
        }
        if (this->hostObject && JavascriptConversion::PropertyQueryFlagsToBoolean(this->hostObject->GetItemReferenceQuery(originalInstance, index, value, requestContext)))
        {
            return PropertyQueryFlags::Property_Found;
        }
        *value = requestContext->GetMissingItemResult();
        return PropertyQueryFlags::Property_NotFound;
    }